

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrameUpdateHoveredWindowAndCaptureFlags(void)

{
  ImGuiWindow **ppIVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  ImGuiWindow *pIVar10;
  long lVar11;
  byte bVar12;
  ImGuiContext *g;
  byte bVar13;
  byte bVar14;
  int iVar15;
  bool bVar16;
  
  pIVar8 = GImGui;
  pIVar9 = GImGui->MovingWindow;
  if ((pIVar9 == (ImGuiWindow *)0x0) || ((pIVar9->Flags & 0x200) != 0)) {
    lVar11 = (long)(GImGui->Windows).Size;
    if (0 < lVar11) {
      lVar11 = lVar11 + 1;
      do {
        pIVar10 = (GImGui->Windows).Data[lVar11 + -2];
        bVar16 = false;
        if ((pIVar10->Active == true) && ((pIVar10->Flags & 0x200) == 0)) {
          fVar3 = (GImGui->Style).TouchExtraPadding.x;
          fVar4 = (GImGui->IO).MousePos.x;
          if ((pIVar10->OuterRectClipped).Min.x - fVar3 <= fVar4) {
            fVar5 = (GImGui->Style).TouchExtraPadding.y;
            fVar6 = (GImGui->IO).MousePos.y;
            bVar16 = fVar6 < (pIVar10->OuterRectClipped).Max.y + fVar5 &&
                     ((pIVar10->OuterRectClipped).Min.y - fVar5 <= fVar6 &&
                     fVar4 < fVar3 + (pIVar10->OuterRectClipped).Max.x);
          }
          else {
            bVar16 = false;
          }
          if (bVar16) {
            pIVar9 = pIVar10;
          }
        }
        if (bVar16) goto LAB_00176441;
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
    pIVar9 = (ImGuiWindow *)0x0;
  }
LAB_00176441:
  GImGui->HoveredWindow = pIVar9;
  if (pIVar9 == (ImGuiWindow *)0x0) {
    pIVar9 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar9 = pIVar9->RootWindow;
  }
  ppIVar1 = &pIVar8->HoveredWindow;
  pIVar8->HoveredRootWindow = pIVar9;
  pIVar10 = GetFrontMostPopupModal();
  if (((pIVar10 != (ImGuiWindow *)0x0) && (pIVar9 != (ImGuiWindow *)0x0)) &&
     (pIVar9->RootWindow != pIVar10)) {
    do {
      if (pIVar9 == pIVar10) goto LAB_00176497;
      pIVar9 = pIVar9->ParentWindow;
    } while (pIVar9 != (ImGuiWindow *)0x0);
    *ppIVar1 = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
LAB_00176497:
  uVar7 = (pIVar8->IO).ConfigFlags;
  if ((uVar7 & 0x10) != 0) {
    *ppIVar1 = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  iVar15 = -1;
  lVar11 = 0;
  bVar12 = 0;
  do {
    if ((pIVar8->IO).MouseClicked[lVar11] == true) {
      bVar16 = true;
      if (*ppIVar1 == (ImGuiWindow *)0x0) {
        bVar16 = (pIVar8->OpenPopupStack).Size != 0;
      }
      (pIVar8->IO).MouseDownOwned[lVar11] = bVar16;
    }
    bVar16 = (pIVar8->IO).MouseDown[lVar11];
    if (bVar16 == true) {
      if (iVar15 != -1) {
        fVar3 = (pIVar8->IO).MouseClickedTime[iVar15];
        pfVar2 = (pIVar8->IO).MouseClickedTime + lVar11;
        if (fVar3 < *pfVar2 || fVar3 == *pfVar2) goto LAB_00176501;
      }
      iVar15 = (int)lVar11;
    }
LAB_00176501:
    bVar12 = bVar12 & 1 | bVar16;
    lVar11 = lVar11 + 1;
    if (lVar11 == 5) {
      if (iVar15 == -1) {
        bVar13 = 1;
      }
      else {
        bVar13 = (pIVar8->IO).MouseDownOwned[iVar15];
      }
      if (pIVar8->DragDropActive == true) {
        bVar14 = ((byte)pIVar8->DragDropSourceFlags & 0x10) >> 4;
      }
      else {
        bVar14 = 0;
      }
      if (bVar14 == 0 && (bVar13 & 1) == 0) {
        *ppIVar1 = (ImGuiWindow *)0x0;
        pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
      }
      if (pIVar8->WantCaptureMouseNextFrame == -1) {
        if ((bVar13 == 0) || ((bVar16 = true, *ppIVar1 == (ImGuiWindow *)0x0 && (bVar12 == 0)))) {
          bVar16 = (pIVar8->OpenPopupStack).Size != 0;
        }
        (pIVar8->IO).WantCaptureMouse = bVar16;
      }
      else {
        (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
      }
      if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
        bVar16 = pIVar8->ActiveId != 0 || pIVar10 != (ImGuiWindow *)0x0;
      }
      else {
        bVar16 = pIVar8->WantCaptureKeyboardNextFrame != 0;
      }
      (pIVar8->IO).WantCaptureKeyboard = bVar16;
      if (((uVar7 & 9) == 1) && ((pIVar8->IO).NavActive != false)) {
        (pIVar8->IO).WantCaptureKeyboard = true;
      }
      (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
  } while( true );
}

Assistant:

void ImGui::NewFrameUpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    g.HoveredWindow = (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoInputs)) ? g.MovingWindow : FindHoveredWindow();
    g.HoveredRootWindow = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetFrontMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredRootWindow = g.HoveredWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to imgui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to imgui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}